

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O3

double TestSpectra::CH3T_spectrum(double xMin,double xMax)

{
  double __x;
  pointer pdVar1;
  pointer pdVar2;
  ostream *poVar3;
  RandomGen *pRVar4;
  undefined4 uVar5;
  double dVar6;
  initializer_list<double> __l;
  allocator_type local_89;
  undefined1 local_88 [16];
  vector<double,_std::allocator<double>_> local_78;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  double local_18;
  
  local_88._8_8_ = local_88._0_8_;
  local_50 = 18.5898;
  if (xMax <= 18.5898) {
    local_50 = xMax;
  }
  local_60 = 0.0;
  if (0.0 <= xMin) {
    local_60 = xMin;
  }
  if ((((local_60 != 0.0) || (NAN(local_60))) || (local_50 != 18.5898)) || (NAN(local_50))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"WARNING: Recommended energy range is 0 to ",0x2a);
    poVar3 = std::ostream::_M_insert<double>(18.5898);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," keV",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_88._0_8_ = local_50 - local_60;
  pRVar4 = RandomGen::rndm();
  dVar6 = RandomGen::rand_uniform(pRVar4);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(dVar6 * (double)local_88._0_8_ + local_60);
  pRVar4 = RandomGen::rndm();
  dVar6 = RandomGen::rand_uniform(pRVar4);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(dVar6 * 11000000.0);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_38;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l,&local_89);
  if (0.0 < local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2]) {
    do {
      dVar6 = *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = dVar6 * dVar6 + (dVar6 + dVar6) * 510.9989461;
      if (dVar6 < 0.0) {
        local_40 = sqrt(dVar6);
      }
      else {
        local_40 = SQRT(dVar6);
      }
      dVar6 = *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_18 = dVar6 + 510.9989461;
      local_88._8_8_ = 0;
      local_88._0_8_ = local_18 * 0.09170123685302745;
      dVar6 = dVar6 * dVar6 + (dVar6 + dVar6) * 510.9989461;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      __x = (*local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start +
            *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start) * 510.9989461;
      if (__x < 0.0) {
        local_58 = dVar6;
        local_48 = sqrt(__x);
        dVar6 = local_58;
      }
      else {
        local_48 = SQRT(__x);
      }
      uVar5 = local_88._12_4_;
      dVar6 = local_88._0_8_ / dVar6;
      local_88._8_4_ = local_88._8_4_;
      local_88._0_8_ = dVar6;
      local_88._12_4_ = uVar5;
      local_20 = *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_58 = exp(-dVar6);
      pRVar4 = RandomGen::rndm();
      RandomGen::VonNeumann
                (&local_38,pRVar4,local_60,local_50,0.0,11000000.0,
                 *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1],
                 ((local_40 / local_18) * -0.001427 + 1.002037) *
                 (1.0 / (1.0 - local_58)) *
                 (double)local_88._0_8_ *
                 local_48 * (local_20 + 510.9989461) * (18.5898 - local_20) * (18.5898 - local_20));
      pdVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar1 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pdVar1 != (double *)0x0) {
        operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
        if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
    } while (0.0 < local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2]);
  }
  local_88._0_8_ =
       *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start;
  operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return (double)local_88._0_8_;
}

Assistant:

double TestSpectra::CH3T_spectrum(double xMin, double xMax) {
  double m_e = ElectronRestMassEnergy;  // e- rest mass-energy [keV]
  double aa = 0.0072973525664;          // fine structure constant
  double ZZ = 2.;
  double qValue = 18.5898;  // tritium beta decay endpoint [keV]

  if (xMax > qValue) xMax = qValue;
  if (xMin < 0.) xMin = 0.;
  if (xMin != 0. || xMax != qValue)
    cerr << "WARNING: Recommended energy range is 0 to " << qValue << " keV"
         << endl;
  double yMax = 1.1e7;  // top of the beta decay E histogram
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double B =
        sqrt(xyTry[0] * xyTry[0] + 2. * xyTry[0] * m_e) / (xyTry[0] + m_e);
    double x = (2. * M_PI * ZZ * aa) * (xyTry[0] + m_e) /
               sqrt(xyTry[0] * xyTry[0] + 2. * xyTry[0] * m_e);
    double FuncValue = (sqrt(2. * xyTry[0] * m_e) * (xyTry[0] + m_e) *
                        (qValue - xyTry[0]) * (qValue - xyTry[0]) * x *
                        (1. / (1. - exp(-x))) * (1.002037 - 0.001427 * (B)));
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, 0., yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}